

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O0

void __thiscall cppforth::Forth::dplus(Forth *this)

{
  uint uVar1;
  uint uVar2;
  anon_union_8_4_a234c5df_for_data_ local_20;
  DCell d2;
  DCell d1;
  Forth *this_local;
  
  requireDStackDepth(this,4,"D+");
  uVar1 = ForthStack<unsigned_int>::getTop(&this->dStack,1);
  uVar2 = ForthStack<unsigned_int>::getTop(&this->dStack);
  DCell::DCell(&d2,uVar1,uVar2);
  uVar1 = ForthStack<unsigned_int>::getTop(&this->dStack,3);
  uVar2 = ForthStack<unsigned_int>::getTop(&this->dStack,2);
  DCell::DCell((DCell *)&local_20.Cells,uVar1,uVar2);
  ForthStack<unsigned_int>::pop(&this->dStack);
  ForthStack<unsigned_int>::pop(&this->dStack);
  d2.data_ = (anon_union_8_4_a234c5df_for_data_)((long)d2.data_ + local_20.Dcells);
  ForthStack<unsigned_int>::setTop(&this->dStack,1,d2.data_.Cells.lo);
  ForthStack<unsigned_int>::setTop(&this->dStack,0,d2.data_.Cells.hi);
  return;
}

Assistant:

void dplus(){
			REQUIRE_DSTACK_DEPTH(4, "D+");
			DCell d1(dStack.getTop(1), dStack.getTop());
			DCell d2(dStack.getTop(3), dStack.getTop(2));
			dStack.pop();dStack.pop();
			d1.data_.Dcells = d1.data_.Dcells+d2.data_.Dcells;
			dStack.setTop(1, d1.data_.Cells.lo);
			dStack.setTop(0, d1.data_.Cells.hi);
		}